

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O3

void __thiscall HighsIis::removeCol(HighsIis *this,HighsInt col)

{
  pointer piVar1;
  long lVar2;
  
  piVar1 = (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = ((long)(this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar1) * 0x40000000 + -0x100000000;
  piVar1[col] = *(int *)((long)piVar1 + (lVar2 >> 0x1e));
  std::vector<int,_std::allocator<int>_>::resize(&this->col_index_,lVar2 >> 0x20);
  return;
}

Assistant:

void HighsIis::removeCol(const HighsInt col) {
  HighsInt num_col = this->col_index_.size();
  assert(col < num_col);
  this->col_index_[col] = this->col_index_[num_col - 1];
  this->col_index_.resize(num_col - 1);
}